

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statisticspooling.cpp
# Opt level: O2

int __thiscall
ncnn::StatisticsPooling::forward(StatisticsPooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int _w;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Mat local_70;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  uVar8 = iVar2 * iVar1;
  uVar11 = 0;
  _w = uVar3 << (this->include_stddev != 0);
  Mat::create(top_blob,_w,bottom_blob->elemsize,opt->blob_allocator);
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar11;
  }
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  fVar12 = 1.0 / ((float)iVar2 * (float)iVar1);
  for (; uVar11 != uVar6; uVar11 = uVar11 + 1) {
    Mat::channel(&local_70,bottom_blob,(int)uVar11);
    pvVar4 = local_70.data;
    Mat::~Mat(&local_70);
    fVar13 = 0.0;
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      fVar13 = fVar13 + *(float *)((long)pvVar4 + uVar5 * 4);
    }
    *(float *)((long)top_blob->data + uVar11 * 4) = fVar13 * fVar12;
  }
  for (lVar7 = (long)(int)uVar3; lVar7 < _w; lVar7 = lVar7 + 1) {
    lVar10 = lVar7 - (int)uVar3;
    Mat::channel(&local_70,bottom_blob,(int)lVar10);
    pvVar4 = local_70.data;
    Mat::~Mat(&local_70);
    fVar13 = 0.0;
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      fVar14 = *(float *)((long)pvVar4 + uVar11 * 4) - *(float *)((long)top_blob->data + lVar10 * 4)
      ;
      fVar13 = fVar13 + fVar14 * fVar14;
    }
    *(float *)((long)top_blob->data + lVar7 * 4) = SQRT(fVar13 * fVar12);
  }
  return 0;
}

Assistant:

int StatisticsPooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;
    size_t elemsize = bottom_blob.elemsize;

    int out_channels = channels;
    if (include_stddev){
        out_channels *= 2;
    }

    top_blob.create(out_channels, elemsize, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++){
        const float* ptr = bottom_blob.channel(q);

        float mean = 0.f;
        for (int i=0; i<size; i++){
            mean += ptr[i];
        }
        top_blob[q] = mean / w / h;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=channels; q<out_channels; q++){
        const float* ptr = bottom_blob.channel(q-channels);

        float std = 0.f;
        for (int i=0; i<size; i++){
            std += pow( (ptr[i] - top_blob[q-channels]), 2);
        }
        top_blob[q] = sqrt(std / w / h);
    }

    return 0;
}